

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall gss::innards::Proof::Proof(Proof *this,ProofOptions *options)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  
  _Var1._M_head_impl = (Imp *)operator_new(0x808);
  Imp::Imp(_Var1._M_head_impl);
  (this->_imp)._M_t.
  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>.
  _M_t.
  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl = _Var1._M_head_impl;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var1._M_head_impl
             ,&options->opb_file);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->log_filename
             ,&options->log_file);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->super_extra_verbose = options->super_extra_verbose;
  (_Var1._M_head_impl)->recover_encoding = options->recover_encoding;
  return;
}

Assistant:

Proof::Proof(const ProofOptions & options) :
    _imp(new Imp)
{
    _imp->opb_filename = options.opb_file;
    _imp->log_filename = options.log_file;
    _imp->super_extra_verbose = options.super_extra_verbose;
    _imp->recover_encoding = options.recover_encoding;
}